

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O3

void dwarf_dealloc_macro_context(Dwarf_Macro_Context mc)

{
  if (mc != (Dwarf_Macro_Context)0x0) {
    dwarf_dealloc(mc->mc_dbg,mc,0x3c);
    return;
  }
  return;
}

Assistant:

void
dwarf_dealloc_macro_context(Dwarf_Macro_Context mc)
{
    Dwarf_Debug dbg = 0;

    if (!mc) {
        return;
    }
    dbg = mc->mc_dbg;
    /* See _dwarf_macro_destructor() here */
    dwarf_dealloc(dbg,mc,DW_DLA_MACRO_CONTEXT);
}